

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest_custom_options.pb.cc
# Opt level: O3

void proto2_unittest::TestMessageWithCustomOptions::MergeImpl
               (MessageLite *to_msg,MessageLite *from_msg)

{
  int iVar1;
  ulong uVar2;
  Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *dest;
  Arena *extraout_RDX;
  Arena *arena;
  uint unaff_EBP;
  string *value;
  MessageLite *this;
  
  if (from_msg == to_msg) {
    value = (string *)to_msg;
    this = from_msg;
    MergeImpl();
    arena = extraout_RDX;
LAB_00ccaa11:
    arena = *(Arena **)((ulong)arena & 0xfffffffffffffffe);
  }
  else {
    dest = google::protobuf::internal::
           TypeDefinedMapFieldBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           ::MutableMap((TypeDefinedMapFieldBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)&to_msg[1]._internal_metadata_);
    google::protobuf::internal::MapFieldBase::SyncMapWithRepeatedField
              ((MapFieldBase *)&from_msg[1]._internal_metadata_);
    google::protobuf::internal::MapMergeFrom<std::__cxx11::string,std::__cxx11::string>
              (dest,(Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&from_msg[2]._internal_metadata_);
    unaff_EBP = *(uint *)&from_msg[1]._vptr_MessageLite;
    if ((unaff_EBP & 1) == 0) goto LAB_00cca9ad;
    uVar2 = from_msg[4]._internal_metadata_.ptr_;
    *(uint *)&to_msg[1]._vptr_MessageLite = *(uint *)&to_msg[1]._vptr_MessageLite | 1;
    value = (string *)(uVar2 & 0xfffffffffffffffc);
    this = (MessageLite *)&to_msg[4]._internal_metadata_;
    arena = (Arena *)(to_msg->_internal_metadata_).ptr_;
    if (((ulong)arena & 1) != 0) goto LAB_00ccaa11;
  }
  google::protobuf::internal::ArenaStringPtr::Set<>((ArenaStringPtr *)this,value,arena);
LAB_00cca9ad:
  *(uint *)&to_msg[1]._vptr_MessageLite = *(uint *)&to_msg[1]._vptr_MessageLite | unaff_EBP;
  iVar1 = *(int *)((long)&from_msg[5]._vptr_MessageLite + 4);
  if (iVar1 != 0) {
    if (*(int *)((long)&to_msg[5]._vptr_MessageLite + 4) != iVar1) {
      *(int *)((long)&to_msg[5]._vptr_MessageLite + 4) = iVar1;
    }
    if (iVar1 == 2) {
      *(undefined4 *)&to_msg[5]._vptr_MessageLite = *(undefined4 *)&from_msg[5]._vptr_MessageLite;
    }
  }
  uVar2 = (from_msg->_internal_metadata_).ptr_;
  if ((uVar2 & 1) == 0) {
    return;
  }
  google::protobuf::internal::InternalMetadata::DoMergeFrom<google::protobuf::UnknownFieldSet>
            (&to_msg->_internal_metadata_,(UnknownFieldSet *)((uVar2 & 0xfffffffffffffffe) + 8));
  return;
}

Assistant:

void TestMessageWithCustomOptions::MergeImpl(::google::protobuf::MessageLite& to_msg, const ::google::protobuf::MessageLite& from_msg) {
  auto* const _this = static_cast<TestMessageWithCustomOptions*>(&to_msg);
  auto& from = static_cast<const TestMessageWithCustomOptions&>(from_msg);
  // @@protoc_insertion_point(class_specific_merge_from_start:proto2_unittest.TestMessageWithCustomOptions)
  ABSL_DCHECK_NE(&from, _this);
  ::uint32_t cached_has_bits = 0;
  (void) cached_has_bits;

  _this->_impl_.map_field_.MergeFrom(from._impl_.map_field_);
  cached_has_bits = from._impl_._has_bits_[0];
  if ((cached_has_bits & 0x00000001u) != 0) {
    _this->_internal_set_field1(from._internal_field1());
  }
  _this->_impl_._has_bits_[0] |= cached_has_bits;
  if (const uint32_t oneof_from_case = from._impl_._oneof_case_[0]) {
    const uint32_t oneof_to_case = _this->_impl_._oneof_case_[0];
    const bool oneof_needs_init = oneof_to_case != oneof_from_case;
    if (oneof_needs_init) {
      if (oneof_to_case != 0) {
        _this->clear_AnOneof();
      }
      _this->_impl_._oneof_case_[0] = oneof_from_case;
    }

    switch (oneof_from_case) {
      case kOneofField: {
        _this->_impl_.AnOneof_.oneof_field_ = from._impl_.AnOneof_.oneof_field_;
        break;
      }
      case ANONEOF_NOT_SET:
        break;
    }
  }
  _this->_internal_metadata_.MergeFrom<::google::protobuf::UnknownFieldSet>(from._internal_metadata_);
}